

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

float __thiscall ODDLParser::Value::getFloat(Value *this)

{
  float v;
  float local_c;
  
  if (this->m_type == ddl_float) {
    memcpy(&local_c,this->m_data,this->m_size);
    return local_c;
  }
  return *(float *)this->m_data;
}

Assistant:

float Value::getFloat() const {
    if( m_type == ddl_float ) {
        float v;
        ::memcpy( &v, m_data, m_size );
        return ( float ) v;
    } else {
        float tmp;
        ::memcpy( &tmp, m_data, 4 );
        return ( float ) tmp;
    }
}